

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objnam.c
# Opt level: O1

boolean wishymatch(char *u_str,char *o_str,boolean retry_inverted)

{
  char cVar1;
  bool bVar2;
  boolean bVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  size_t sVar7;
  char *pcVar8;
  char buf [256];
  char acStack_128 [256];
  
  pcVar8 = acStack_128;
  if ((flags.debug != '\0') && (iVar4 = strcmp(o_str,"beartrap"), iVar4 == 0)) {
    iVar4 = strncasecmp(o_str,u_str,8);
    return iVar4 == 0;
  }
  bVar3 = fuzzymatch(u_str,o_str," -",'\x01');
  if (bVar3 != '\0') {
    return '\x01';
  }
  if (retry_inverted == '\0') goto LAB_0020753f;
  pcVar5 = strstri(u_str," of ");
  pcVar6 = strstri(o_str," of ");
  if (pcVar6 == (char *)0x0 && pcVar5 != (char *)0x0) {
    strcpy(acStack_128,pcVar5 + 4);
    sVar7 = strlen(acStack_128);
    (acStack_128 + sVar7)[0] = ' ';
    (acStack_128 + sVar7)[1] = '\0';
    pcVar6 = eos(acStack_128);
    if (u_str < pcVar5) {
      do {
        cVar1 = *u_str;
        u_str = u_str + 1;
        *pcVar6 = cVar1;
        pcVar6 = pcVar6 + 1;
      } while (u_str != pcVar5);
    }
    *pcVar6 = '\0';
    pcVar5 = o_str;
LAB_0020752b:
    bVar3 = fuzzymatch(pcVar8,pcVar5," -",'\x01');
    bVar2 = false;
  }
  else {
    bVar3 = pcVar6 == (char *)0x0;
    if (pcVar5 == (char *)0x0 && !(bool)bVar3) {
      strcpy(acStack_128,pcVar6 + 4);
      sVar7 = strlen(acStack_128);
      (acStack_128 + sVar7)[0] = ' ';
      (acStack_128 + sVar7)[1] = '\0';
      pcVar8 = eos(acStack_128);
      if (o_str < pcVar6) {
        do {
          cVar1 = *o_str;
          o_str = o_str + 1;
          *pcVar8 = cVar1;
          pcVar8 = pcVar8 + 1;
        } while (o_str != pcVar6);
      }
      *pcVar8 = '\0';
      pcVar5 = acStack_128;
      pcVar8 = u_str;
      goto LAB_0020752b;
    }
    bVar2 = true;
  }
  if (!bVar2) {
    return bVar3;
  }
LAB_0020753f:
  iVar4 = strncmp(o_str,"dwarvish ",9);
  if (iVar4 == 0) {
    iVar4 = strncasecmp(u_str,"dwarven ",8);
    if (iVar4 != 0) {
      return '\0';
    }
    pcVar5 = u_str + 8;
    pcVar8 = o_str + 9;
  }
  else {
    iVar4 = strncmp(o_str,"elven ",6);
    if (iVar4 == 0) {
      iVar4 = strncasecmp(u_str,"elvish ",7);
      if (iVar4 == 0) {
        pcVar5 = u_str + 7;
      }
      else {
        iVar4 = strncasecmp(u_str,"elfin ",6);
        if (iVar4 != 0) {
          return '\0';
        }
        pcVar5 = u_str + 6;
      }
      pcVar8 = o_str + 6;
    }
    else {
      iVar4 = strcmp(o_str,"aluminum");
      if (iVar4 != 0) {
        return '\0';
      }
      iVar4 = strncasecmp(u_str,"aluminium",0xffffffffffffffff);
      if (iVar4 != 0) {
        return '\0';
      }
      pcVar5 = u_str + 9;
      pcVar8 = o_str + 8;
    }
  }
  bVar3 = fuzzymatch(pcVar5,pcVar8," -",'\x01');
  return bVar3;
}

Assistant:

static boolean wishymatch(const char *u_str,	/* from user, so might be variant spelling */
			  const char *o_str,	/* from objects[], so is in canonical form */
			  boolean retry_inverted)	/* optional extra "of" handling */
{
	/* special case: wizards can wish for traps.  The object is "beartrap"
	 * and the trap is "bear trap", so to let wizards wish for both we
	 * must not fuzzymatch.
	 */
	if (wizard && !strcmp(o_str, "beartrap"))
	    return !strncmpi(o_str, u_str, 8);

	/* ignore spaces & hyphens and upper/lower case when comparing */
	if (fuzzymatch(u_str, o_str, " -", TRUE)) return TRUE;

	if (retry_inverted) {
	    const char *u_of, *o_of;
	    char *p, buf[BUFSZ];

	    /* when just one of the strings is in the form "foo of bar",
	       convert it into "bar foo" and perform another comparison */
	    u_of = strstri(u_str, " of ");
	    o_of = strstri(o_str, " of ");
	    if (u_of && !o_of) {
		strcpy(buf, u_of + 4);
		p = eos(strcat(buf, " "));
		while (u_str < u_of) *p++ = *u_str++;
		*p = '\0';
		return fuzzymatch(buf, o_str, " -", TRUE);
	    } else if (o_of && !u_of) {
		strcpy(buf, o_of + 4);
		p = eos(strcat(buf, " "));
		while (o_str < o_of) *p++ = *o_str++;
		*p = '\0';
		return fuzzymatch(u_str, buf, " -", TRUE);
	    }
	}

	/* [note: if something like "elven speed boots" ever gets added, these
	   special cases should be changed to call wishymatch() recursively in
	   order to get the "of" inversion handling] */
	if (!strncmp(o_str, "dwarvish ", 9)) {
	    if (!strncmpi(u_str, "dwarven ", 8))
		return fuzzymatch(u_str + 8, o_str + 9, " -", TRUE);
	} else if (!strncmp(o_str, "elven ", 6)) {
	    if (!strncmpi(u_str, "elvish ", 7))
		return fuzzymatch(u_str + 7, o_str + 6, " -", TRUE);
	    else if (!strncmpi(u_str, "elfin ", 6))
		return fuzzymatch(u_str + 6, o_str + 6, " -", TRUE);
	} else if (!strcmp(o_str, "aluminum")) {
		/* this special case doesn't really fit anywhere else... */
		/* (note that " wand" will have been stripped off by now) */
	    if (!strcmpi(u_str, "aluminium"))
		return fuzzymatch(u_str + 9, o_str + 8, " -", TRUE);
	}

	return FALSE;
}